

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

File * File::parse_file_binary(File *__return_storage_ptr__,ifstream *in)

{
  variant<std::__cxx11::string,int,double> *this;
  pointer pIVar1;
  byte bVar2;
  void *pvVar3;
  File *pFVar4;
  byte bVar5;
  u2 uVar6;
  u2 uVar7;
  u4 uVar8;
  int iVar9;
  size_t sVar10;
  variant_alternative_t<0UL,_variant<basic_string<char>,_int,_double>_> *pvVar11;
  undefined8 *puVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  short sVar17;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  Instruction IVar18;
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> start;
  size_t pos;
  vector<vm::Function,_std::allocator<vm::Function>_> functions;
  Function fun;
  vector<vm::Constant,_std::allocator<vm::Constant>_> constants;
  size_type bufferSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  anon_class_24_3_d3a0271c read2bytes;
  anon_class_24_3_94a76bc3 readInstruction;
  anon_class_24_3_d3a0271c read4bytes;
  anon_class_24_3_d3a0271c readByte;
  undefined8 uStack_290;
  undefined1 local_288 [20];
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  size_t local_260;
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 local_230 [8];
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
  local_228;
  byte local_208;
  u4 local_200;
  uint local_1fc;
  vector<vm::Constant,_std::allocator<vm::Constant>_> local_1f8;
  Instruction local_1d8;
  ulong local_1c8;
  void *local_1c0;
  long local_1b8;
  long local_1b0;
  uint *local_1a8;
  undefined8 local_1a0;
  uint local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  uint *local_188;
  undefined8 local_180;
  uint local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  uint *local_168;
  undefined8 local_160;
  uint local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  uint *local_148;
  undefined8 local_140;
  uint local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  uint *local_128;
  undefined8 local_120;
  uint local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  uint *local_108;
  undefined8 local_100;
  uint local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  File *local_e8;
  anon_class_24_3_d3a0271c local_e0;
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> local_c8;
  anon_class_24_3_94a76bc3 local_b0;
  vector<vm::Function,_std::allocator<vm::Function>_> local_98;
  vector<vm::Constant,_std::allocator<vm::Constant>_> local_78;
  anon_class_24_3_d3a0271c local_60;
  anon_class_24_3_d3a0271c local_48;
  
  uStack_290 = (undefined *)0x1106cb;
  __first._8_8_ = 0xffffffff;
  __first._M_sbuf = *(streambuf_type **)(in + *(long *)(*(long *)in + -0x18) + 0xe8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1c0,__first,
             (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
             (allocator_type *)local_230);
  local_e0.pos = &local_260;
  local_260 = 0;
  local_1c8 = local_1b8 - (long)local_1c0;
  local_e0.bufferSize = &local_1c8;
  local_b0.readByte = &local_48;
  local_b0.read2bytes = &local_e0;
  local_b0.read4bytes = &local_60;
  uStack_290 = (undefined *)0x11073f;
  local_e0.buffer = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c0;
  local_60.pos = local_e0.pos;
  local_60.bufferSize = local_e0.bufferSize;
  local_60.buffer = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c0;
  local_48.pos = local_e0.pos;
  local_48.bufferSize = local_e0.bufferSize;
  local_48.buffer = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c0;
  uVar8 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(local_b0.read4bytes);
  if (uVar8 != 0x43303a29) {
    uStack_290 = (undefined *)0x111039;
    puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
    uStack_290 = (undefined *)0x111063;
    local_108 = &local_f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"invalid binary file: invalid magic","");
    *puVar12 = &PTR__InvalidFile_001247e8;
    puVar12[1] = puVar12 + 3;
    if (local_108 == &local_f8) {
      *(uint *)(puVar12 + 3) = local_f8;
      *(undefined4 *)((long)puVar12 + 0x1c) = uStack_f4;
      *(undefined4 *)(puVar12 + 4) = uStack_f0;
      *(undefined4 *)((long)puVar12 + 0x24) = uStack_ec;
    }
    else {
      puVar12[1] = local_108;
      puVar12[3] = CONCAT44(uStack_f4,local_f8);
    }
    puVar12[2] = local_100;
    local_100 = 0;
    local_f8 = local_f8 & 0xffffff00;
    uStack_290 = &UNK_0011119c;
    local_108 = &local_f8;
    __cxa_throw(puVar12,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
  }
  uStack_290 = (undefined *)0x110757;
  local_200 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_60);
  uStack_290 = (undefined *)0x110773;
  local_e8 = __return_storage_ptr__;
  uVar6 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_e0);
  local_1f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (uVar6 != 0) {
    this = (variant<std::__cxx11::string,int,double> *)(local_230 + 8);
    uVar16 = 0;
    do {
      local_228._M_rest = (_Variadic_union<int,_double>)((long)local_230 + 0x18);
      local_228._8_8_ = (Instruction *)0x0;
      local_228._16_8_ = local_228._16_8_ & 0xffffffffffffff00;
      local_208 = 0;
      uStack_290 = (undefined *)0x1107d0;
      local_230[0] = (allocator_type)
                     parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_48);
      if (local_230[0] == (allocator_type)0x0) {
        uStack_290 = (undefined *)0x110871;
        uVar7 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_e0);
        if (local_1c8 < uVar7 + local_260) {
          uStack_290 = (undefined *)0x110eaa;
          puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
          pIVar1 = (pointer)(local_288 + 0x10);
          uStack_290 = (undefined *)0x110ecc;
          local_288._0_8_ = pIVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,"invalid binary file: incomplete string constant","");
          *puVar12 = &PTR__InvalidFile_001247e8;
          puVar12[1] = puVar12 + 3;
          if ((pointer)local_288._0_8_ == pIVar1) {
            *(undefined4 *)(puVar12 + 3) = local_288._16_4_;
            *(undefined4 *)((long)puVar12 + 0x1c) = uStack_274;
            *(undefined4 *)(puVar12 + 4) = uStack_270;
            *(undefined4 *)((long)puVar12 + 0x24) = uStack_26c;
          }
          else {
            puVar12[1] = local_288._0_8_;
            puVar12[3] = stack0xfffffffffffffd88;
          }
          puVar12[2] = local_288._8_8_;
          local_288._8_8_ = (pointer)0x0;
          stack0xfffffffffffffd88 = (pointer)((ulong)stack0xfffffffffffffd88 & 0xffffffffffffff00);
          uStack_290 = (undefined *)0x11102f;
          local_288._0_8_ = pIVar1;
          __cxa_throw(puVar12,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
        }
        local_258._0_8_ = local_258 + 0x10;
        local_258._8_8_ = (pointer)0x0;
        local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00;
        sVar17 = uVar7 + 1;
        while (sVar17 = sVar17 + -1, sVar17 != 0) {
          local_260 = local_260 + 1;
          uStack_290 = (undefined *)0x1108cd;
          std::__cxx11::string::push_back
                    ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_258);
        }
        uStack_290 = (undefined *)0x1108da;
        std::variant<std::__cxx11::string,int,double>::operator=
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_258);
        if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
          uStack_290 = (undefined *)0x1108f6;
          operator_delete((void *)local_258._0_8_,local_248._M_allocated_capacity + 1);
        }
      }
      else if (local_230[0] == (allocator_type)0x1) {
        uStack_290 = (undefined *)0x110851;
        uVar8 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_60);
        local_288._0_4_ = uVar8;
        uStack_290 = (undefined *)0x11085f;
        std::variant<std::__cxx11::string,int,double>::operator=(this,(int *)local_288);
      }
      else {
        if (local_230[0] != (allocator_type)0x2) {
          uStack_290 = (undefined *)0x110dea;
          puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
          uStack_290 = (undefined *)0x110e14;
          local_128 = &local_118;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_128,"invalid binary file: invalid constant type","");
          *puVar12 = &PTR__InvalidFile_001247e8;
          puVar12[1] = puVar12 + 3;
          if (local_128 == &local_118) {
            *(uint *)(puVar12 + 3) = local_118;
            *(undefined4 *)((long)puVar12 + 0x1c) = uStack_114;
            *(undefined4 *)(puVar12 + 4) = uStack_110;
            *(undefined4 *)((long)puVar12 + 0x24) = uStack_10c;
          }
          else {
            puVar12[1] = local_128;
            puVar12[3] = CONCAT44(uStack_114,local_118);
          }
          puVar12[2] = local_120;
          local_120 = 0;
          local_118 = local_118 & 0xffffff00;
          uStack_290 = &UNK_00110fae;
          local_128 = &local_118;
          __cxa_throw(puVar12,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
        }
        if (local_1c8 < local_260 + 8) {
          uStack_290 = (undefined *)0x110e50;
          puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
          pIVar1 = (pointer)(local_288 + 0x10);
          uStack_290 = (undefined *)0x110e72;
          local_288._0_8_ = pIVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,"invalid binary file: incomplete double constant","");
          *puVar12 = &PTR__InvalidFile_001247e8;
          puVar12[1] = puVar12 + 3;
          if ((pointer)local_288._0_8_ == pIVar1) {
            *(undefined4 *)(puVar12 + 3) = local_288._16_4_;
            *(undefined4 *)((long)puVar12 + 0x1c) = uStack_274;
            *(undefined4 *)(puVar12 + 4) = uStack_270;
            *(undefined4 *)((long)puVar12 + 0x24) = uStack_26c;
          }
          else {
            puVar12[1] = local_288._0_8_;
            puVar12[3] = stack0xfffffffffffffd88;
          }
          puVar12[2] = local_288._8_8_;
          local_288._8_8_ = (pointer)0x0;
          stack0xfffffffffffffd88 = (pointer)((ulong)stack0xfffffffffffffd88 & 0xffffffffffffff00);
          uStack_290 = (undefined *)0x110ff1;
          local_288._0_8_ = pIVar1;
          __cxa_throw(puVar12,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
        }
        lVar13 = 8;
        sVar10 = local_260;
        do {
          local_260 = sVar10 + 1;
          *(undefined1 *)((long)&uStack_290 + lVar13 + 7) =
               *(undefined1 *)((long)local_1c0 + sVar10);
          lVar13 = lVar13 + -1;
          sVar10 = local_260;
        } while (lVar13 != 0);
        local_258._0_8_ = local_288._0_8_;
        uStack_290 = (undefined *)0x11083f;
        std::variant<std::__cxx11::string,int,double>::operator=(this,(double *)local_258);
      }
      uStack_290 = (undefined *)0x110908;
      std::vector<vm::Constant,_std::allocator<vm::Constant>_>::emplace_back<vm::Constant>
                (&local_1f8,(Constant *)local_230);
      uStack_290 = (undefined *)0x110920;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>_&>
        ::_S_vtable._M_arr[local_208]._M_data)
                ((anon_class_1_0_00000001 *)local_288,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                  *)this);
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar6);
  }
  uStack_290 = (undefined *)0x110939;
  uVar6 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_e0);
  local_288._0_8_ = (pointer)0x0;
  local_288._8_8_ = (Instruction *)0x0;
  stack0xfffffffffffffd88 = (Instruction *)0x0;
  if (uVar6 != 0) {
    uVar16 = (uint)uVar6;
    do {
      uStack_290 = (undefined *)0x110969;
      IVar18 = parse_file_binary::anon_class_24_3_94a76bc3::operator()(&local_b0);
      local_230[0] = (allocator_type)IVar18.op;
      local_230[1] = IVar18._1_1_;
      local_230._2_2_ = IVar18._2_2_;
      local_230._4_2_ = (undefined2)IVar18.x;
      local_230._6_2_ = IVar18.x._2_2_;
      local_228._M_rest._0_4_ = (undefined4)IVar18.y;
      if ((pointer)local_288._8_8_ == stack0xfffffffffffffd88) {
        uStack_290 = (undefined *)0x1109a0;
        std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::
        _M_realloc_insert<vm::Instruction>
                  ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)local_288,
                   (iterator)local_288._8_8_,(Instruction *)local_230);
      }
      else {
        *(_Uninitialized<int,_true> *)(local_288._8_8_ + 8) = local_228._M_rest._M_first._M_storage;
        *(long *)local_288._8_8_ = IVar18._0_8_;
        local_288._8_8_ = local_288._8_8_ + 0xc;
      }
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  uStack_290 = (undefined *)0x1109b1;
  uVar6 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_e0);
  local_258._0_8_ = (pointer)0x0;
  local_258._8_8_ = (pointer)0x0;
  local_248._M_allocated_capacity = 0;
  if (uVar6 != 0) {
    local_1fc = (uint)uVar6;
    uVar16 = 0;
    bVar5 = 0;
    do {
      bVar2 = bVar5;
      local_228._M_rest._0_4_ = (undefined4)0;
      local_228._4_4_ = 0;
      local_228._8_8_ = (Instruction *)0x0;
      local_228._16_8_ = (Instruction *)0x0;
      uStack_290 = (undefined *)0x110a06;
      uVar6 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_e0);
      local_230[0] = SUB21(uVar6,0);
      local_230[1] = (undefined1)(uVar6 >> 8);
      uVar14 = ((long)local_1f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_1f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      if (uVar14 < uVar6 || uVar14 - uVar6 == 0) {
        uStack_290 = (undefined *)0x110ce5;
        puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
        uStack_290 = (undefined *)0x110d0f;
        local_148 = &local_138;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_148,"invalid binary file: function name not found","");
        *puVar12 = &PTR__InvalidFile_001247e8;
        puVar12[1] = puVar12 + 3;
        if (local_148 == &local_138) {
          *(uint *)(puVar12 + 3) = local_138;
          *(undefined4 *)((long)puVar12 + 0x1c) = uStack_134;
          *(undefined4 *)(puVar12 + 4) = uStack_130;
          *(undefined4 *)((long)puVar12 + 0x24) = uStack_12c;
        }
        else {
          puVar12[1] = local_148;
          puVar12[3] = CONCAT44(uStack_134,local_138);
        }
        puVar12[2] = local_140;
        local_140 = 0;
        local_138 = local_138 & 0xffffff00;
        uStack_290 = &LAB_00110ddb;
        local_148 = &local_138;
        __cxa_throw(puVar12,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
      }
      if ((&(local_1f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
             super__Vector_impl_data._M_start)->type)[(uint)uVar6 * 0x30] != STRING) {
        uStack_290 = (undefined *)0x110c86;
        puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
        uStack_290 = (undefined *)0x110cb0;
        local_168 = &local_158;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_168,"invalid binary file: function name not found","");
        *puVar12 = &PTR__InvalidFile_001247e8;
        puVar12[1] = puVar12 + 3;
        if (local_168 == &local_158) {
          *(uint *)(puVar12 + 3) = local_158;
          *(undefined4 *)((long)puVar12 + 0x1c) = uStack_154;
          *(undefined4 *)(puVar12 + 4) = uStack_150;
          *(undefined4 *)((long)puVar12 + 0x24) = uStack_14c;
        }
        else {
          puVar12[1] = local_168;
          puVar12[3] = CONCAT44(uStack_154,local_158);
        }
        puVar12[2] = local_160;
        local_160 = 0;
        local_158 = local_158 & 0xffffff00;
        uStack_290 = &UNK_00110d88;
        local_168 = &local_158;
        __cxa_throw(puVar12,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
      }
      uStack_290 = (undefined *)0x110a5c;
      pvVar11 = std::get<0ul,std::__cxx11::string,int,double>
                          ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                            *)((long)&((local_1f8.
                                        super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->value).
                                      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                                      .
                                      super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                      .
                                      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                      .
                                      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                      .
                                      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                      .
                                      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>
                              + (ulong)((uint)uVar6 * 0x30)));
      uStack_290 = (undefined *)0x110a6e;
      iVar9 = std::__cxx11::string::compare((char *)pvVar11);
      uStack_290 = (undefined *)0x110a7c;
      local_230._2_2_ = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_e0);
      uStack_290 = (undefined *)0x110a89;
      local_230._4_2_ = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_e0);
      uStack_290 = (undefined *)0x110a96;
      uVar6 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_e0);
      if (uVar6 != 0) {
        uVar15 = (uint)uVar6;
        do {
          uStack_290 = (undefined *)0x110aa6;
          local_1d8 = parse_file_binary::anon_class_24_3_94a76bc3::operator()(&local_b0);
          if (local_228._8_8_ == local_228._16_8_) {
            uStack_290 = (undefined *)0x110af0;
            std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::
            _M_realloc_insert<vm::Instruction>
                      ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)(local_230 + 8),
                       (iterator)local_228._8_8_,&local_1d8);
          }
          else {
            *(u4 *)(local_228._8_8_ + 8) = local_1d8.y;
            *(undefined8 *)local_228._8_8_ = local_1d8._0_8_;
            local_228._8_8_ = local_228._8_8_ + 0xc;
          }
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
      }
      uStack_290 = (undefined *)0x110b03;
      std::vector<vm::Function,_std::allocator<vm::Function>_>::emplace_back<vm::Function>
                ((vector<vm::Function,_std::allocator<vm::Function>_> *)local_258,
                 (Function *)local_230);
      pvVar3 = (void *)CONCAT44(local_228._4_4_,local_228._M_rest._M_first._M_storage);
      if (pvVar3 != (void *)0x0) {
        uStack_290 = (undefined *)0x110b1a;
        operator_delete(pvVar3,local_228._16_8_ - (long)pvVar3);
      }
      pFVar4 = local_e8;
      uVar16 = uVar16 + 1;
      bVar5 = bVar2 | iVar9 == 0;
    } while (uVar16 != local_1fc);
    if ((bool)(bVar2 | iVar9 == 0)) {
      if (local_260 == local_1b8 - (long)local_1c0) {
        local_78.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_78.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_78.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_c8.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_288._0_8_;
        local_c8.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_288._8_8_;
        local_c8.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = stack0xfffffffffffffd88;
        local_288._0_8_ = (pointer)0x0;
        local_288._8_8_ = (pointer)0x0;
        stack0xfffffffffffffd88 = (pointer)0x0;
        local_98.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_258._0_8_;
        local_98.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_258._8_8_;
        local_98.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_248._M_allocated_capacity;
        local_258._0_8_ = (pointer)0x0;
        local_258._8_8_ = (pointer)0x0;
        local_248._M_allocated_capacity = 0;
        uStack_290 = (undefined *)0x110be6;
        File(local_e8,local_200,&local_78,&local_c8,&local_98);
        uStack_290 = (undefined *)0x110bf3;
        std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector(&local_98);
        if (local_c8.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          uStack_290 = (undefined *)0x110c10;
          operator_delete(local_c8.
                          super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_c8.
                                super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.
                                super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        uStack_290 = (undefined *)0x110c1d;
        std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_78);
        uStack_290 = (undefined *)0x110c27;
        std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector
                  ((vector<vm::Function,_std::allocator<vm::Function>_> *)local_258);
        if ((pointer)local_288._0_8_ != (pointer)0x0) {
          uStack_290 = (undefined *)0x110c3d;
          operator_delete((void *)local_288._0_8_,(long)stack0xfffffffffffffd88 - local_288._0_8_);
        }
        uStack_290 = (undefined *)0x110c4a;
        std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_1f8);
        if (local_1c0 != (void *)0x0) {
          uStack_290 = (undefined *)0x110c67;
          operator_delete(local_1c0,local_1b0 - (long)local_1c0);
        }
        return pFVar4;
      }
      uStack_290 = (undefined *)0x11109f;
      puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
      uStack_290 = (undefined *)0x1110c9;
      local_1a8 = &local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a8,"invalid binary file: unused content","");
      *puVar12 = &PTR__InvalidFile_001247e8;
      puVar12[1] = puVar12 + 3;
      if (local_1a8 == &local_198) {
        *(uint *)(puVar12 + 3) = local_198;
        *(undefined4 *)((long)puVar12 + 0x1c) = uStack_194;
        *(undefined4 *)(puVar12 + 4) = uStack_190;
        *(undefined4 *)((long)puVar12 + 0x24) = uStack_18c;
      }
      else {
        puVar12[1] = local_1a8;
        puVar12[3] = CONCAT44(uStack_194,local_198);
      }
      puVar12[2] = local_1a0;
      local_1a0 = 0;
      local_198 = local_198 & 0xffffff00;
      uStack_290 = &LAB_001111ec;
      local_1a8 = &local_198;
      __cxa_throw(puVar12,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
    }
  }
  uStack_290 = (undefined *)0x110f04;
  puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
  uStack_290 = (undefined *)0x110f2e;
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,"invalid binary file: main() not found","");
  *puVar12 = &PTR__InvalidFile_001247e8;
  puVar12[1] = puVar12 + 3;
  if (local_188 == &local_178) {
    *(uint *)(puVar12 + 3) = local_178;
    *(undefined4 *)((long)puVar12 + 0x1c) = uStack_174;
    *(undefined4 *)(puVar12 + 4) = uStack_170;
    *(undefined4 *)((long)puVar12 + 0x24) = uStack_16c;
  }
  else {
    puVar12[1] = local_188;
    puVar12[3] = CONCAT44(uStack_174,local_178);
  }
  puVar12[2] = local_180;
  local_180 = 0;
  local_178 = local_178 & 0xffffff00;
  uStack_290 = &UNK_00111149;
  local_188 = &local_178;
  __cxa_throw(puVar12,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
}

Assistant:

File File::parse_file_binary(std::ifstream& in) {
    // read raw
    const std::vector<unsigned char> buffer(std::istreambuf_iterator<char>(in), {});
    size_t pos = 0;
    const auto bufferSize = buffer.size();
    const auto readByte = [&]() {
        if (pos + 1 > bufferSize) {
            throw InvalidFile("incomplete binary file");
        }
        vm::u1 rtv = static_cast<vm::u1>(buffer[pos]);
        pos += 1;
        return rtv;
    };
    const auto read2bytes = [&] {
        if (pos + 2 > bufferSize) {
            throw InvalidFile("incomplete binary file");
        }
        vm::u2 rtv = static_cast<vm::u2>(
            (buffer[pos] << 8) | buffer[pos+1]
        );
        pos += 2;
        return rtv;
    };
    const auto read4bytes = [&]() {
        if (pos + 4 > bufferSize) {
            throw InvalidFile("incomplete binary file");
        }
        vm::u4 rtv = static_cast<vm::u4>(
            (buffer[pos] << 24) | (buffer[pos+1] << 16) | (buffer[pos+2] << 8) | buffer[pos+3]
        );
        pos += 4;
        return rtv;
    };
    const auto readDouble = [&]() {
        if (pos + 8 > bufferSize) {
            throw InvalidFile("invalid binary file: incomplete double constant");
        }
        union {
            vm::double_t d;
            unsigned char b[8];
        } rtv;
        for (int i = 7; i >= 0; --i) {
            rtv.b[i] = buffer[pos++];
        }
        return rtv.d;
    };
    const auto readString = [&](vm::u2 length) {
        if (pos + length > bufferSize) {
            throw InvalidFile("invalid binary file: incomplete string constant");
        }
        vm::str_t rtv;
        while (length-- ) {
            rtv += buffer[pos++];
        }
        return rtv;
    };
    const auto readInstruction = [&]() {
        vm::Instruction ins;
        ins.op = static_cast<vm::OpCode>(readByte());
        if (vm::nameOfOpCode.count(ins.op) == 0) {
            throw InvalidFile("invalid binary file: invalid opcode");
        }
        if (auto it = vm::paramSizeOfOpCode.find(ins.op); it != vm::paramSizeOfOpCode.end()) {
            auto paramSizes = it->second;
            switch (paramSizes[0]) {
            case 1: ins.x = readByte(); break;
            case 2: ins.x = read2bytes(); break;
            case 4: ins.x = read4bytes(); break;
            default: assert(("unexpected error", false));
            }
            if (paramSizes.size() == 2) {
                ins.y = read4bytes();
            }
        }
        return ins;
    };

    // parse magic
    auto magic = read4bytes(); 
    if (magic != magic_v) {
        throw InvalidFile("invalid binary file: invalid magic");
    }

    // parse version
    auto version = read4bytes(); 

    // parse constants
    auto constantsCount = read2bytes();
    std::vector<vm::Constant> constants;
    for (int j = 0; j < constantsCount; ++j) {
        vm::Constant constant;
        constant.type = static_cast<vm::Constant::Type>(readByte());
        switch (constant.type)
        {
        case vm::Constant::Type::STRING: {
            auto length = read2bytes();
            constant.value = std::move(readString(length));
        } break;
        case vm::Constant::Type::INT: {
            constant.value = static_cast<vm::int_t>(read4bytes());
        } break;
        case vm::Constant::Type::DOUBLE: {
            constant.value = readDouble();
        } break;
        default:
            throw InvalidFile("invalid binary file: invalid constant type");
        }
        constants.push_back(std::move(constant));
    }

    // parse start
    auto instructionsCount = read2bytes();
    std::vector<vm::Instruction> start;
    for (int j = 0; j < instructionsCount; ++j) {
        start.push_back(std::move(readInstruction()));
    }

    // parse functions
    auto functionsCount = read2bytes();
    std::vector<vm::Function> functions;
    bool mainFound = false;
    for (int j = 0; j < functionsCount; ++j) {
        vm::Function fun;
        fun.nameIndex = read2bytes();
        if (fun.nameIndex >= constants.size()) {
            throw InvalidFile("invalid binary file: function name not found");
        }
        if (constants[fun.nameIndex].type != vm::Constant::Type::STRING) {
            throw InvalidFile("invalid binary file: function name not found");
        }
        if (std::get<vm::str_t>(constants[fun.nameIndex].value) == "main") {
            mainFound = true;
        }
        fun.paramSize = read2bytes();
        fun.level = read2bytes();
        auto instructionsCount = read2bytes();
        for (int k = 0; k < instructionsCount; ++k) {
            fun.instructions.push_back(std::move(readInstruction()));
        }
        functions.push_back(std::move(fun));
    }

    if (!mainFound) {
        throw InvalidFile("invalid binary file: main() not found");
    }

    if (pos != buffer.size()) {
        throw InvalidFile("invalid binary file: unused content");
    }

    return File{version, std::move(constants), std::move(start), std::move(functions)};
}